

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O0

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createAsm(LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  PSNode *this_00;
  PSNodesSeq *pPVar1;
  PSNode *in_RSI;
  Value *in_RDI;
  LLVMPointerGraphBuilder *unaff_retaddr;
  PSNode *n;
  PSNode **in_stack_ffffffffffffffe8;
  Value *val;
  
  val = in_RDI;
  if (!createAsm::warned) {
    llvm::errs();
    llvm::raw_ostream::operator<<((raw_ostream *)in_RSI,(char *)in_stack_ffffffffffffffe8);
    createAsm::warned = true;
  }
  this_00 = PointerGraph::create<(dg::pta::PSNodeType)18,dg::pta::PSNode*&,unsigned_long_const&>
                      ((PointerGraph *)in_RSI,in_stack_ffffffffffffffe8,(unsigned_long *)in_RDI);
  PSNode::setPairedNode(this_00,this_00);
  pPVar1 = addNode(unaff_retaddr,val,in_RSI);
  return pPVar1;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq &
LLVMPointerGraphBuilder::createAsm(const llvm::Instruction *Inst) {
    // we filter irrelevant calls in isRelevantCall()
    // and we don't have assembler there at all. If
    // we are here, then we got here because this
    // is undefined call that returns pointer.
    // In this case return an unknown pointer
    static bool warned = false;
    if (!warned) {
        llvm::errs()
                << "PTA: Inline assembly found, analysis  may be unsound\n";
        warned = true;
    }

    PSNode *n =
            PS.create<PSNodeType::CONSTANT>(UNKNOWN_MEMORY, Offset::UNKNOWN);
    // it is call that returns pointer, so we'd like to have
    // a 'return' node that contains that pointer
    n->setPairedNode(n);
    return addNode(Inst, n);
}